

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.c
# Opt level: O3

int sync_tcp_connect(sync_device *d,char *host,unsigned_short port)

{
  int iVar1;
  int iVar2;
  hostent *phVar3;
  ssize_t sVar4;
  sync_track **ppsVar5;
  char **ppcVar6;
  long lVar7;
  char *__src;
  sockaddr_in sin;
  sockaddr local_c8;
  long local_b8;
  int local_b0;
  
  if (d->sock != -1) {
    close(d->sock);
  }
  phVar3 = gethostbyname(host);
  if (phVar3 != (hostent *)0x0) {
    ppcVar6 = phVar3->h_addr_list;
    __src = *ppcVar6;
    if (__src != (char *)0x0) {
      do {
        ppcVar6 = ppcVar6 + 1;
        iVar1 = phVar3->h_addrtype;
        local_c8.sa_family = (sa_family_t)iVar1;
        local_c8.sa_data._0_2_ = port << 8 | port >> 8;
        memcpy(local_c8.sa_data + 2,__src,(long)phVar3->h_length);
        local_c8.sa_data[6] = '\0';
        local_c8.sa_data[7] = '\0';
        local_c8.sa_data[8] = '\0';
        local_c8.sa_data[9] = '\0';
        local_c8.sa_data[10] = '\0';
        local_c8.sa_data[0xb] = '\0';
        local_c8.sa_data[0xc] = '\0';
        local_c8.sa_data[0xd] = '\0';
        iVar1 = socket(iVar1,1,0);
        if (iVar1 != -1) {
          iVar2 = connect(iVar1,&local_c8,0x10);
          if ((((-1 < iVar2) && (sVar4 = send(iVar1,"hello, synctracker!",0x13,0), sVar4 == 0x13))
              && (sVar4 = recv(iVar1,&local_b8,0xc,0), sVar4 == 0xc)) &&
             (local_b0 == 0x216f6d65 && local_b8 == 0x64202c6f6c6c6568)) {
            d->sock = iVar1;
            if (0 < (int)d->num_tracks) {
              ppsVar5 = d->tracks;
              lVar7 = 0;
              do {
                free(ppsVar5[lVar7]->keys);
                ppsVar5 = d->tracks;
                ppsVar5[lVar7]->keys = (track_key *)0x0;
                ppsVar5[lVar7]->num_keys = 0;
                lVar7 = lVar7 + 1;
                iVar1 = (int)d->num_tracks;
              } while (lVar7 < iVar1);
              if (0 < iVar1) {
                lVar7 = 0;
                while (iVar1 = fetch_track_data(d,d->tracks[lVar7]), iVar1 == 0) {
                  lVar7 = lVar7 + 1;
                  if ((int)d->num_tracks <= lVar7) {
                    return 0;
                  }
                }
                close(d->sock);
                break;
              }
            }
            return 0;
          }
          close(iVar1);
        }
        __src = *ppcVar6;
      } while (__src != (char *)0x0);
    }
  }
  d->sock = -1;
  return -1;
}

Assistant:

int sync_tcp_connect(struct sync_device *d, const char *host, unsigned short port)
{
	int i;
	if (d->sock != INVALID_SOCKET)
		closesocket(d->sock);

	d->sock = server_connect(host, port);
	if (d->sock == INVALID_SOCKET)
		return -1;

	for (i = 0; i < (int)d->num_tracks; ++i) {
		free(d->tracks[i]->keys);
		d->tracks[i]->keys = NULL;
		d->tracks[i]->num_keys = 0;
	}

	for (i = 0; i < (int)d->num_tracks; ++i) {
		if (fetch_track_data(d, d->tracks[i])) {
			closesocket(d->sock);
			d->sock = INVALID_SOCKET;
			return -1;
		}
	}
	return 0;
}